

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_jump
          (irGenerator *this,JumpInstructionKind kind,LabelId bbTrue,LabelId bbFalse,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *condRetName,JumpKind jumpKind)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  JumpInstructionKind in_ESI;
  long in_RDI;
  shared_ptr<mir::inst::JumpInstruction> jumpInst;
  optional<mir::inst::VarId> crn;
  JumpInstruction *in_stack_fffffffffffffe78;
  value_type *__x;
  VarId *in_stack_fffffffffffffe80;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *this_00;
  VarId *in_stack_fffffffffffffe88;
  optional<mir::inst::VarId> *in_stack_fffffffffffffe90;
  int bb_false;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffeb8;
  LabelId in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_f8 [7];
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  irGenerator *in_stack_ffffffffffffffd0;
  undefined4 local_14;
  undefined4 local_10;
  JumpInstructionKind local_c;
  
  std::optional<mir::inst::VarId>::optional((optional<mir::inst::VarId> *)0x2626f3);
  std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr
            ((shared_ptr<mir::inst::JumpInstruction> *)0x262700);
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x26270a);
  if (bVar1) {
    in_stack_fffffffffffffec0 =
         std::
         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe80);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe78);
    in_stack_fffffffffffffebc =
         LeftValueToLabelId((irGenerator *)in_stack_fffffffffffffee0,
                            (LeftVal *)in_stack_fffffffffffffed8);
    mir::inst::VarId::VarId
              (in_stack_fffffffffffffe80,(uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    std::optional<mir::inst::VarId>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    bb_false = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x262785);
  }
  else {
    std::optional<mir::inst::VarId>::operator=
              ((optional<mir::inst::VarId> *)&stack0xffffffffffffffc0);
    bb_false = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  }
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (in_ESI == Return) {
    local_c = Br;
    local_10 = *(undefined4 *)(in_RDI + 0xac);
    local_14 = 0xffffffff;
    bVar1 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x262816);
    if (bVar1) {
      std::variant<int,std::__cxx11::string>::
      variant<std::__cxx11::string_const&,void,void,std::__cxx11::string,void>
                ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffe80);
      std::variant<int,int,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78);
      ir_assign(in_stack_ffffffffffffffd0,(LeftVal *)in_stack_ffffffffffffffc8,
                (RightVal *)in_stack_ffffffffffffffc0);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x262888);
      std::
      variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x262895);
      std::optional<mir::inst::VarId>::reset((optional<mir::inst::VarId> *)0x2628a2);
    }
  }
  operator_new(0x38);
  std::optional<mir::inst::VarId>::optional
            ((optional<mir::inst::VarId> *)in_stack_fffffffffffffe80,
             (optional<mir::inst::VarId> *)in_stack_fffffffffffffe78);
  mir::inst::JumpInstruction::JumpInstruction
            ((JumpInstruction *)CONCAT44(local_14,local_10),local_c,in_stack_fffffffffffffe98,
             bb_false,(optional<mir::inst::VarId> *)in_stack_fffffffffffffe88,
             (JumpKind)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr<mir::inst::JumpInstruction,void>
            ((shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  this_00 = local_f8;
  std::shared_ptr<mir::inst::JumpInstruction>::operator=
            ((shared_ptr<mir::inst::JumpInstruction> *)this_00,
             (shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffffe78);
  std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
            ((shared_ptr<mir::inst::JumpInstruction> *)0x26299b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
                *)in_stack_fffffffffffffec0,
               (key_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  __x = (value_type *)&stack0xfffffffffffffed8;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::
  variant<std::shared_ptr<mir::inst::JumpInstruction>&,void,void,std::shared_ptr<mir::inst::JumpInstruction>,void>
            (this_00,(shared_ptr<mir::inst::JumpInstruction> *)__x);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_00,__x);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x2629fc);
  std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
            ((shared_ptr<mir::inst::JumpInstruction> *)0x262a09);
  return;
}

Assistant:

void irGenerator::ir_jump(mir::inst::JumpInstructionKind kind, LabelId bbTrue,
                          LabelId bbFalse, std::optional<string> condRetName,
                          mir::inst::JumpKind jumpKind) {
  std::optional<VarId> crn;
  shared_ptr<mir::inst::JumpInstruction> jumpInst;

  if (condRetName.has_value()) {
    crn = VarId(LeftValueToLabelId(condRetName.value()));
  } else {
    crn = std::nullopt;
  }

  if (kind == mir::inst::JumpInstructionKind::Return) {
    kind = mir::inst::JumpInstructionKind::Br;
    bbTrue = _ReturnBlockLabelId;
    bbFalse = -1;
    if (crn.has_value()) {
      ir_assign(_ReturnVarName, condRetName.value());
      crn.reset();
    }
    jumpKind = mir::inst::JumpKind::Undefined;
  }

  jumpInst = shared_ptr<mir::inst::JumpInstruction>(
      new mir::inst::JumpInstruction(kind, bbTrue, bbFalse, crn, jumpKind));

  _funcNameToInstructions[_funcStack.back()].push_back(jumpInst);
}